

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray
          (TGlslangToSpvTraverser *this,TType *glslangType,TConstUnionArray *consts,int *nextConst,
          bool specConstant)

{
  anon_union_8_11_a9b10978_for_TConstUnion_0 aVar1;
  TConstUnionVector *pTVar2;
  Id IVar3;
  int iVar4;
  int iVar5;
  TBasicType t;
  uint uVar6;
  int iVar7;
  Id operand;
  TTypeList *pTVar8;
  undefined4 extraout_var;
  Builder *this_00;
  pointer pTVar9;
  uint uVar10;
  longlong lVar11;
  unsigned_long_long uVar12;
  int i;
  bool bVar13;
  float fVar14;
  undefined4 uVar15;
  Id local_ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvConsts;
  TType elementType;
  
  spvConsts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spvConsts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  spvConsts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IVar3 = convertGlslangToSpvType(this,glslangType,SUB81(consts,0));
  iVar4 = (*glslangType->_vptr_TType[0x1d])(glslangType);
  if ((char)iVar4 == '\0') {
    iVar4 = (*glslangType->_vptr_TType[0x1c])(glslangType);
    if ((char)iVar4 == '\0') {
      if ((glslangType->field_0xa & 0x60) == 0) {
        iVar4 = (*glslangType->_vptr_TType[0x25])(glslangType);
        if ((char)iVar4 == '\0') {
          iVar4 = (*glslangType->_vptr_TType[0xc])(glslangType);
          if (iVar4 < 2) {
            if ((*(uint *)&glslangType->field_0x8 >> 0x1b & 1) == 0) {
              pTVar2 = consts->unionArray;
              if (pTVar2 == (TConstUnionVector *)0x0) {
                iVar4 = 0;
              }
              else {
                iVar4 = (int)((ulong)((long)(pTVar2->
                                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                            ).
                                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pTVar2->
                                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                           ).
                                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
              }
              iVar5 = *nextConst;
              iVar7 = (*glslangType->_vptr_TType[7])(glslangType);
              switch(iVar7) {
              case 1:
                fVar14 = 0.0;
                if (iVar5 < iVar4) {
                  fVar14 = (float)(consts->unionArray->
                                  super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ).
                                  super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.
                                  dConst;
                }
                IVar3 = spv::Builder::makeFloatConstant(&this->builder,fVar14,specConstant);
                break;
              case 2:
                iVar7 = 0;
                uVar15 = 0;
                if (iVar5 < iVar4) {
                  aVar1 = (consts->unionArray->
                          super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ).
                          super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0;
                  iVar7 = aVar1.iConst;
                  uVar15 = (undefined4)((ulong)aVar1 >> 0x20);
                }
                IVar3 = spv::Builder::makeDoubleConstant
                                  (&this->builder,(double)CONCAT44(uVar15,iVar7),specConstant);
                break;
              case 3:
                spv::Builder::addCapability(&this->builder,CapabilityFloat16);
                fVar14 = 0.0;
                if (iVar5 < iVar4) {
                  fVar14 = (float)(consts->unionArray->
                                  super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ).
                                  super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.
                                  dConst;
                }
                IVar3 = spv::Builder::makeFloat16Constant(&this->builder,fVar14,specConstant);
                break;
              case 4:
                spv::Builder::addCapability(&this->builder,CapabilityInt8);
                iVar7 = 0;
                if (iVar5 < iVar4) {
                  iVar7 = (int)(consts->unionArray->
                               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ).
                               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.i8Const
                  ;
                }
                IVar3 = spv::Builder::makeInt8Constant(&this->builder,iVar7,specConstant);
                break;
              case 5:
                spv::Builder::addCapability(&this->builder,CapabilityInt8);
                uVar6 = 0;
                if (iVar5 < iVar4) {
                  uVar6 = (uint)(consts->unionArray->
                                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ).
                                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.
                                u8Const;
                }
                IVar3 = spv::Builder::makeUint8Constant(&this->builder,uVar6,specConstant);
                break;
              case 6:
                spv::Builder::addCapability(&this->builder,CapabilityInt16);
                iVar7 = 0;
                if (iVar5 < iVar4) {
                  iVar7 = (int)(consts->unionArray->
                               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ).
                               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.
                               i16Const;
                }
                IVar3 = spv::Builder::makeInt16Constant(&this->builder,iVar7,specConstant);
                break;
              case 7:
                spv::Builder::addCapability(&this->builder,CapabilityInt16);
                uVar6 = 0;
                if (iVar5 < iVar4) {
                  uVar6 = (uint)(consts->unionArray->
                                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ).
                                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.
                                u16Const;
                }
                IVar3 = spv::Builder::makeUint16Constant(&this->builder,uVar6,specConstant);
                break;
              case 8:
                iVar7 = 0;
                if (iVar5 < iVar4) {
                  iVar7 = (consts->unionArray->
                          super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ).
                          super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.iConst;
                }
                IVar3 = spv::Builder::makeIntConstant(&this->builder,iVar7,specConstant);
                break;
              case 9:
                uVar6 = 0;
                if (iVar5 < iVar4) {
                  uVar6 = (consts->unionArray->
                          super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ).
                          super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.uConst;
                }
                IVar3 = spv::Builder::makeUintConstant(&this->builder,uVar6,specConstant);
                break;
              case 10:
                if (iVar5 < iVar4) {
                  lVar11 = (consts->unionArray->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.i64Const;
                }
                else {
                  lVar11 = 0;
                }
                IVar3 = spv::Builder::makeInt64Constant(&this->builder,lVar11,specConstant);
                break;
              case 0xb:
                if (iVar5 < iVar4) {
                  uVar12 = (consts->unionArray->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u64Const;
                }
                else {
                  uVar12 = 0;
                }
                IVar3 = spv::Builder::makeUint64Constant(&this->builder,uVar12,specConstant);
                break;
              case 0xc:
                if (iVar5 < iVar4) {
                  bVar13 = (consts->unionArray->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.bConst;
                }
                else {
                  bVar13 = false;
                }
                IVar3 = spv::Builder::makeBoolConstant(&this->builder,bVar13,specConstant);
                break;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                              ,0x295a,
                              "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray(const glslang::TType &, const glslang::TConstUnionArray &, int &, bool)"
                             );
              case 0x12:
                if (iVar5 < iVar4) {
                  uVar12 = (consts->unionArray->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u64Const;
                }
                else {
                  uVar12 = 0;
                }
                operand = spv::Builder::makeUint64Constant(&this->builder,uVar12,specConstant);
                IVar3 = spv::Builder::createUnaryOp(&this->builder,OpBitcast,IVar3,operand);
                break;
              case 0x1b:
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&elementType,
                           (((consts->unionArray->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.sConst)->
                           _M_dataplus)._M_p,(allocator<char> *)&local_ec);
                IVar3 = spv::Builder::getStringId(&this->builder,(string *)&elementType);
                std::__cxx11::string::_M_dispose();
              }
              *nextConst = *nextConst + 1;
              goto LAB_003471b9;
            }
LAB_003472e5:
            iVar4 = (*glslangType->_vptr_TType[0x16])(glslangType);
            uVar6 = glslang::TSmallArrayVector::getDimSize
                              (*(TSmallArrayVector **)(CONCAT44(extraout_var,iVar4) + 8),0);
          }
          else {
            if ((*(uint *)&glslangType->field_0x8 >> 0x1b & 1) != 0) goto LAB_003472e5;
            uVar6 = (*glslangType->_vptr_TType[0xc])(glslangType);
          }
          this_00 = &this->builder;
          while (bVar13 = uVar6 != 0, uVar6 = uVar6 - 1, bVar13) {
            pTVar2 = consts->unionArray;
            if (pTVar2 == (TConstUnionVector *)0x0) {
              iVar4 = 0;
            }
            else {
              iVar4 = (int)((ulong)((long)(pTVar2->
                                          super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                          ).
                                          super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pTVar2->
                                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                         ).
                                         super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
            }
            iVar5 = *nextConst;
            iVar7 = (*glslangType->_vptr_TType[7])(glslangType);
            switch(iVar7) {
            case 1:
              fVar14 = 0.0;
              if (iVar5 < iVar4) {
                fVar14 = (float)(consts->unionArray->
                                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ).
                                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.dConst
                ;
              }
              elementType._vptr_TType._0_4_ = spv::Builder::makeFloatConstant(this_00,fVar14,false);
              break;
            case 2:
              iVar7 = 0;
              uVar15 = 0;
              if (iVar5 < iVar4) {
                aVar1 = (consts->unionArray->
                        super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ).
                        super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0;
                iVar7 = aVar1.iConst;
                uVar15 = (undefined4)((ulong)aVar1 >> 0x20);
              }
              elementType._vptr_TType._0_4_ =
                   spv::Builder::makeDoubleConstant(this_00,(double)CONCAT44(uVar15,iVar7),false);
              break;
            case 3:
              spv::Builder::addCapability(this_00,CapabilityFloat16);
              fVar14 = 0.0;
              if (iVar5 < iVar4) {
                fVar14 = (float)(consts->unionArray->
                                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ).
                                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.dConst
                ;
              }
              elementType._vptr_TType._0_4_ =
                   spv::Builder::makeFloat16Constant(this_00,fVar14,false);
              break;
            case 4:
              spv::Builder::addCapability(this_00,CapabilityInt8);
              iVar7 = 0;
              if (iVar5 < iVar4) {
                iVar7 = (int)(consts->unionArray->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.i8Const;
              }
              elementType._vptr_TType._0_4_ = spv::Builder::makeInt8Constant(this_00,iVar7,false);
              break;
            case 5:
              spv::Builder::addCapability(this_00,CapabilityInt8);
              uVar10 = 0;
              if (iVar5 < iVar4) {
                uVar10 = (uint)(consts->unionArray->
                               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ).
                               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u8Const
                ;
              }
              elementType._vptr_TType._0_4_ = spv::Builder::makeUint8Constant(this_00,uVar10,false);
              break;
            case 6:
              spv::Builder::addCapability(this_00,CapabilityInt16);
              iVar7 = 0;
              if (iVar5 < iVar4) {
                iVar7 = (int)(consts->unionArray->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.i16Const;
              }
              elementType._vptr_TType._0_4_ = spv::Builder::makeInt16Constant(this_00,iVar7,false);
              break;
            case 7:
              spv::Builder::addCapability(this_00,CapabilityInt16);
              uVar10 = 0;
              if (iVar5 < iVar4) {
                uVar10 = (uint)(consts->unionArray->
                               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ).
                               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.
                               u16Const;
              }
              elementType._vptr_TType._0_4_ = spv::Builder::makeUint16Constant(this_00,uVar10,false)
              ;
              break;
            case 8:
              iVar7 = 0;
              if (iVar5 < iVar4) {
                iVar7 = (consts->unionArray->
                        super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ).
                        super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.iConst;
              }
              elementType._vptr_TType._0_4_ = spv::Builder::makeIntConstant(this_00,iVar7,false);
              break;
            case 9:
              uVar10 = 0;
              if (iVar5 < iVar4) {
                uVar10 = (consts->unionArray->
                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ).
                         super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.uConst;
              }
              elementType._vptr_TType._0_4_ = spv::Builder::makeUintConstant(this_00,uVar10,false);
              break;
            case 10:
              if (iVar5 < iVar4) {
                lVar11 = (consts->unionArray->
                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ).
                         super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.i64Const;
              }
              else {
                lVar11 = 0;
              }
              elementType._vptr_TType._0_4_ = spv::Builder::makeInt64Constant(this_00,lVar11,false);
              break;
            case 0xb:
              if (iVar5 < iVar4) {
                uVar12 = (consts->unionArray->
                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ).
                         super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u64Const;
              }
              else {
                uVar12 = 0;
              }
              elementType._vptr_TType._0_4_ = spv::Builder::makeUint64Constant(this_00,uVar12,false)
              ;
              break;
            case 0xc:
              if (iVar5 < iVar4) {
                bVar13 = (consts->unionArray->
                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ).
                         super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.bConst;
              }
              else {
                bVar13 = false;
              }
              elementType._vptr_TType._0_4_ = spv::Builder::makeBoolConstant(this_00,bVar13,false);
              break;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                            ,0x291f,
                            "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray(const glslang::TType &, const glslang::TConstUnionArray &, int &, bool)"
                           );
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&spvConsts,(uint *)&elementType);
            *nextConst = *nextConst + 1;
          }
        }
        else {
          pTVar8 = glslang::TType::getStruct(glslangType);
          for (pTVar9 = (pTVar8->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ).
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pTVar8 = glslang::TType::getStruct(glslangType),
              pTVar9 != (pTVar8->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ).
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pTVar9 = pTVar9 + 1) {
            elementType._vptr_TType._0_4_ =
                 createSpvConstantFromConstUnionArray(this,pTVar9->type,consts,nextConst,false);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&spvConsts,(uint *)&elementType);
          }
        }
      }
      else {
        t = (*glslangType->_vptr_TType[7])(glslangType);
        glslang::TType::TType(&elementType,t,EvqTemporary,1,0,0,false);
        local_ec = createSpvConstantFromConstUnionArray(this,&elementType,consts,nextConst,false);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&spvConsts,&local_ec);
      }
    }
    else {
      glslang::TType::TType(&elementType,glslangType,0,false);
      for (iVar4 = 0; iVar5 = (*glslangType->_vptr_TType[0xd])(glslangType), iVar4 < iVar5;
          iVar4 = iVar4 + 1) {
        local_ec = createSpvConstantFromConstUnionArray(this,&elementType,consts,nextConst,false);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&spvConsts,&local_ec);
      }
    }
  }
  else {
    glslang::TType::TType(&elementType,glslangType,0,false);
    for (iVar4 = 0; iVar5 = (*glslangType->_vptr_TType[0xf])(glslangType), iVar4 < iVar5;
        iVar4 = iVar4 + 1) {
      local_ec = createSpvConstantFromConstUnionArray(this,&elementType,consts,nextConst,false);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&spvConsts,&local_ec);
    }
  }
  IVar3 = spv::Builder::makeCompositeConstant(&this->builder,IVar3,&spvConsts,false);
LAB_003471b9:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&spvConsts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return IVar3;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray(const glslang::TType& glslangType,
    const glslang::TConstUnionArray& consts, int& nextConst, bool specConstant)
{
    // vector of constants for SPIR-V
    std::vector<spv::Id> spvConsts;

    // Type is used for struct and array constants
    spv::Id typeId = convertGlslangToSpvType(glslangType);

    if (glslangType.isArray()) {
        glslang::TType elementType(glslangType, 0);
        for (int i = 0; i < glslangType.getOuterArraySize(); ++i)
            spvConsts.push_back(createSpvConstantFromConstUnionArray(elementType, consts, nextConst, false));
    } else if (glslangType.isMatrix()) {
        glslang::TType vectorType(glslangType, 0);
        for (int col = 0; col < glslangType.getMatrixCols(); ++col)
            spvConsts.push_back(createSpvConstantFromConstUnionArray(vectorType, consts, nextConst, false));
    } else if (glslangType.isCoopMat()) {
        glslang::TType componentType(glslangType.getBasicType());
        spvConsts.push_back(createSpvConstantFromConstUnionArray(componentType, consts, nextConst, false));
    } else if (glslangType.isStruct()) {
        glslang::TVector<glslang::TTypeLoc>::const_iterator iter;
        for (iter = glslangType.getStruct()->begin(); iter != glslangType.getStruct()->end(); ++iter)
            spvConsts.push_back(createSpvConstantFromConstUnionArray(*iter->type, consts, nextConst, false));
    } else if (glslangType.getVectorSize() > 1 || glslangType.isCoopVecNV()) {
        unsigned int numComponents = glslangType.isCoopVecNV() ? glslangType.getTypeParameters()->arraySizes->getDimSize(0) : glslangType.getVectorSize();
        for (unsigned int i = 0; i < numComponents; ++i) {
            bool zero = nextConst >= consts.size();
            switch (glslangType.getBasicType()) {
            case glslang::EbtInt:
                spvConsts.push_back(builder.makeIntConstant(zero ? 0 : consts[nextConst].getIConst()));
                break;
            case glslang::EbtUint:
                spvConsts.push_back(builder.makeUintConstant(zero ? 0 : consts[nextConst].getUConst()));
                break;
            case glslang::EbtFloat:
                spvConsts.push_back(builder.makeFloatConstant(zero ? 0.0F : (float)consts[nextConst].getDConst()));
                break;
            case glslang::EbtBool:
                spvConsts.push_back(builder.makeBoolConstant(zero ? false : consts[nextConst].getBConst()));
                break;
            case glslang::EbtInt8:
                builder.addCapability(spv::CapabilityInt8);
                spvConsts.push_back(builder.makeInt8Constant(zero ? 0 : consts[nextConst].getI8Const()));
                break;
            case glslang::EbtUint8:
                builder.addCapability(spv::CapabilityInt8);
                spvConsts.push_back(builder.makeUint8Constant(zero ? 0 : consts[nextConst].getU8Const()));
                break;
            case glslang::EbtInt16:
                builder.addCapability(spv::CapabilityInt16);
                spvConsts.push_back(builder.makeInt16Constant(zero ? 0 : consts[nextConst].getI16Const()));
                break;
            case glslang::EbtUint16:
                builder.addCapability(spv::CapabilityInt16);
                spvConsts.push_back(builder.makeUint16Constant(zero ? 0 : consts[nextConst].getU16Const()));
                break;
            case glslang::EbtInt64:
                spvConsts.push_back(builder.makeInt64Constant(zero ? 0 : consts[nextConst].getI64Const()));
                break;
            case glslang::EbtUint64:
                spvConsts.push_back(builder.makeUint64Constant(zero ? 0 : consts[nextConst].getU64Const()));
                break;
            case glslang::EbtDouble:
                spvConsts.push_back(builder.makeDoubleConstant(zero ? 0.0 : consts[nextConst].getDConst()));
                break;
            case glslang::EbtFloat16:
                builder.addCapability(spv::CapabilityFloat16);
                spvConsts.push_back(builder.makeFloat16Constant(zero ? 0.0F : (float)consts[nextConst].getDConst()));
                break;
            default:
                assert(0);
                break;
            }
            ++nextConst;
        }
    } else {
        // we have a non-aggregate (scalar) constant
        bool zero = nextConst >= consts.size();
        spv::Id scalar = 0;
        switch (glslangType.getBasicType()) {
        case glslang::EbtInt:
            scalar = builder.makeIntConstant(zero ? 0 : consts[nextConst].getIConst(), specConstant);
            break;
        case glslang::EbtUint:
            scalar = builder.makeUintConstant(zero ? 0 : consts[nextConst].getUConst(), specConstant);
            break;
        case glslang::EbtFloat:
            scalar = builder.makeFloatConstant(zero ? 0.0F : (float)consts[nextConst].getDConst(), specConstant);
            break;
        case glslang::EbtBool:
            scalar = builder.makeBoolConstant(zero ? false : consts[nextConst].getBConst(), specConstant);
            break;
        case glslang::EbtInt8:
            builder.addCapability(spv::CapabilityInt8);
            scalar = builder.makeInt8Constant(zero ? 0 : consts[nextConst].getI8Const(), specConstant);
            break;
        case glslang::EbtUint8:
            builder.addCapability(spv::CapabilityInt8);
            scalar = builder.makeUint8Constant(zero ? 0 : consts[nextConst].getU8Const(), specConstant);
            break;
        case glslang::EbtInt16:
            builder.addCapability(spv::CapabilityInt16);
            scalar = builder.makeInt16Constant(zero ? 0 : consts[nextConst].getI16Const(), specConstant);
            break;
        case glslang::EbtUint16:
            builder.addCapability(spv::CapabilityInt16);
            scalar = builder.makeUint16Constant(zero ? 0 : consts[nextConst].getU16Const(), specConstant);
            break;
        case glslang::EbtInt64:
            scalar = builder.makeInt64Constant(zero ? 0 : consts[nextConst].getI64Const(), specConstant);
            break;
        case glslang::EbtUint64:
            scalar = builder.makeUint64Constant(zero ? 0 : consts[nextConst].getU64Const(), specConstant);
            break;
        case glslang::EbtDouble:
            scalar = builder.makeDoubleConstant(zero ? 0.0 : consts[nextConst].getDConst(), specConstant);
            break;
        case glslang::EbtFloat16:
            builder.addCapability(spv::CapabilityFloat16);
            scalar = builder.makeFloat16Constant(zero ? 0.0F : (float)consts[nextConst].getDConst(), specConstant);
            break;
        case glslang::EbtReference:
            scalar = builder.makeUint64Constant(zero ? 0 : consts[nextConst].getU64Const(), specConstant);
            scalar = builder.createUnaryOp(spv::OpBitcast, typeId, scalar);
            break;
        case glslang::EbtString:
            scalar = builder.getStringId(consts[nextConst].getSConst()->c_str());
            break;
        default:
            assert(0);
            break;
        }
        ++nextConst;
        return scalar;
    }

    return builder.makeCompositeConstant(typeId, spvConsts);
}